

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O1

int run_test_udp_options6(void)

{
  ushort uVar1;
  int iVar2;
  int extraout_EAX;
  ulong uVar3;
  uv_loop_t *loop;
  anon_union_28_2_e90107a3_for_address *paVar4;
  uv_handle_t *handle;
  bool bVar5;
  int64_t eval_a;
  int64_t eval_b;
  sockaddr_in6 addr;
  undefined1 auStack_1c0 [16];
  uv_udp_t uStack_1b0;
  uv_udp_t uStack_f8;
  code *pcStack_40;
  long local_38 [2];
  sockaddr_in6 local_28;
  
  pcStack_40 = (code *)0x1dc74b;
  iVar2 = uv_interface_addresses((uv_interface_address_t **)&local_28,(int *)local_38);
  if (iVar2 != 0) {
LAB_001dc7da:
    pcStack_40 = (code *)0x1dc7df;
    run_test_udp_options6_cold_1();
    return 7;
  }
  if ((long)(int)local_38[0] < 1) {
    pcStack_40 = (code *)0x1dc7da;
    uv_free_interface_addresses((uv_interface_address_t *)local_28._0_8_,(int)local_38[0]);
    goto LAB_001dc7da;
  }
  paVar4 = (anon_union_28_2_e90107a3_for_address *)(local_28._0_8_ + 0x14);
  uVar3 = 1;
  do {
    uVar1 = (paVar4->address4).sin_family;
    if (uVar1 == 10) break;
    paVar4 = (anon_union_28_2_e90107a3_for_address *)((long)paVar4 + 0x60);
    bVar5 = uVar3 < (ulong)(long)(int)local_38[0];
    uVar3 = uVar3 + 1;
  } while (bVar5);
  pcStack_40 = (code *)0x1dc78d;
  uv_free_interface_addresses((uv_interface_address_t *)local_28._0_8_,(int)local_38[0]);
  if (uVar1 != 10) goto LAB_001dc7da;
  pcStack_40 = (code *)0x1dc7a9;
  iVar2 = uv_ip6_addr("::",0x23a3,&local_28);
  local_38[0] = (long)iVar2;
  local_38[1] = 0;
  if (local_38[0] == 0) {
    pcStack_40 = (code *)0x1dc7cd;
    udp_options_test((sockaddr *)&local_28);
    return 0;
  }
  pcStack_40 = run_test_udp_no_autobind;
  run_test_udp_options6_cold_2();
  handle = (uv_handle_t *)auStack_1c0;
  pcStack_40 = (code *)(ulong)uVar1;
  loop = uv_default_loop();
  iVar2 = uv_udp_init(loop,&uStack_f8);
  uStack_1b0.data = (void *)(long)iVar2;
  auStack_1c0._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)uStack_1b0.data == (uv_loop_t *)0x0) {
    uStack_1b0.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar2 = uv_udp_set_multicast_ttl(&uStack_f8,0x20);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    if (uStack_1b0.data != (void *)auStack_1c0._0_8_) goto LAB_001dcad7;
    uStack_1b0.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar2 = uv_udp_set_broadcast(&uStack_f8,1);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    if (uStack_1b0.data != (void *)auStack_1c0._0_8_) goto LAB_001dcae4;
    uStack_1b0.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar2 = uv_udp_set_ttl(&uStack_f8,1);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    if (uStack_1b0.data != (void *)auStack_1c0._0_8_) goto LAB_001dcaf1;
    uStack_1b0.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar2 = uv_udp_set_multicast_loop(&uStack_f8,1);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    if (uStack_1b0.data != (void *)auStack_1c0._0_8_) goto LAB_001dcafe;
    uStack_1b0.data = (uv_loop_t *)0xfffffffffffffff7;
    iVar2 = uv_udp_set_multicast_interface(&uStack_f8,"0.0.0.0");
    auStack_1c0._0_8_ = SEXT48(iVar2);
    if (uStack_1b0.data != (void *)auStack_1c0._0_8_) goto LAB_001dcb0b;
    uv_close((uv_handle_t *)&uStack_f8,(uv_close_cb)0x0);
    iVar2 = uv_udp_init_ex(loop,&uStack_1b0,0x102);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    auStack_1c0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c0._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcb18;
    iVar2 = uv_udp_set_multicast_ttl(&uStack_1b0,0x20);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    auStack_1c0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c0._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcb25;
    iVar2 = uv_udp_set_broadcast(&uStack_1b0,1);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    auStack_1c0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c0._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcb32;
    iVar2 = uv_udp_set_ttl(&uStack_1b0,1);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    auStack_1c0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c0._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcb3f;
    iVar2 = uv_udp_set_multicast_loop(&uStack_1b0,1);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    auStack_1c0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c0._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcb4c;
    iVar2 = uv_udp_set_multicast_interface(&uStack_1b0,"0.0.0.0");
    auStack_1c0._0_8_ = SEXT48(iVar2);
    auStack_1c0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c0._0_8_ != (uv_loop_t *)0x0) goto LAB_001dcb59;
    uv_close((uv_handle_t *)&uStack_1b0,(uv_close_cb)0x0);
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    auStack_1c0._0_8_ = SEXT48(iVar2);
    auStack_1c0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c0._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      auStack_1c0._0_8_ = (uv_loop_t *)0x0;
      iVar2 = uv_loop_close(loop);
      auStack_1c0._8_8_ = SEXT48(iVar2);
      if (auStack_1c0._0_8_ == auStack_1c0._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dcb73;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_001dcad7:
    run_test_udp_no_autobind_cold_2();
LAB_001dcae4:
    run_test_udp_no_autobind_cold_3();
LAB_001dcaf1:
    run_test_udp_no_autobind_cold_4();
LAB_001dcafe:
    run_test_udp_no_autobind_cold_5();
LAB_001dcb0b:
    run_test_udp_no_autobind_cold_6();
LAB_001dcb18:
    run_test_udp_no_autobind_cold_7();
LAB_001dcb25:
    run_test_udp_no_autobind_cold_8();
LAB_001dcb32:
    run_test_udp_no_autobind_cold_9();
LAB_001dcb3f:
    run_test_udp_no_autobind_cold_10();
LAB_001dcb4c:
    run_test_udp_no_autobind_cold_11();
LAB_001dcb59:
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_001dcb73:
  run_test_udp_no_autobind_cold_14();
  iVar2 = uv_is_closing(handle);
  if (iVar2 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(udp_options6) {
  struct sockaddr_in6 addr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT_OK(uv_ip6_addr("::", TEST_PORT, &addr));
  return udp_options_test((const struct sockaddr*) &addr);
}